

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brktrans.cpp
# Opt level: O0

void __thiscall
icu_63::BreakTransliterator::handleTransliterate
          (BreakTransliterator *this,Replaceable *text,UTransPosition *offsets,UBool isIncremental)

{
  bool bVar1;
  UBool UVar2;
  byte bVar3;
  UChar32 UVar4;
  int32_t iVar5;
  int32_t iVar6;
  uint uVar7;
  Locale *key;
  BreakIterator *pBVar8;
  UVector32 *pUVar9;
  int local_1c0;
  UVector32 *local_110;
  BreakTransliterator *nonConstThis_1;
  Mutex m_1;
  int local_b8;
  int lastBoundary;
  int delta;
  int type;
  UChar32 cp;
  int32_t boundary;
  UnicodeString sText;
  BreakTransliterator *nonConstThis;
  Mutex m;
  LocalPointerBase<icu_63::UVector32> local_38;
  LocalPointer<icu_63::UVector32> boundaries;
  LocalPointer<icu_63::BreakIterator> bi;
  UErrorCode status;
  UBool isIncremental_local;
  UTransPosition *offsets_local;
  Replaceable *text_local;
  BreakTransliterator *this_local;
  
  bi.super_LocalPointerBase<icu_63::BreakIterator>.ptr._0_4_ = U_ZERO_ERROR;
  bi.super_LocalPointerBase<icu_63::BreakIterator>.ptr._7_1_ = isIncremental;
  LocalPointer<icu_63::BreakIterator>::LocalPointer
            ((LocalPointer<icu_63::BreakIterator> *)&boundaries,(BreakIterator *)0x0);
  LocalPointer<icu_63::UVector32>::LocalPointer
            ((LocalPointer<icu_63::UVector32> *)&local_38,(UVector32 *)0x0);
  Mutex::Mutex((Mutex *)&nonConstThis,(UMutex *)0x0);
  LocalPointer<icu_63::UVector32>::moveFrom
            ((LocalPointer<icu_63::UVector32> *)&local_38,&this->cachedBoundaries);
  pBVar8 = (BreakIterator *)&this->cachedBI;
  LocalPointer<icu_63::BreakIterator>::moveFrom
            ((LocalPointer<icu_63::BreakIterator> *)&boundaries,
             (LocalPointer<icu_63::BreakIterator> *)pBVar8);
  Mutex::~Mutex((Mutex *)&nonConstThis);
  UVar2 = LocalPointerBase<icu_63::BreakIterator>::isNull
                    ((LocalPointerBase<icu_63::BreakIterator> *)&boundaries);
  if (UVar2 != '\0') {
    key = Locale::getEnglish();
    pBVar8 = BreakIterator::createWordInstance(key,(UErrorCode *)&bi);
    LocalPointer<icu_63::BreakIterator>::adoptInstead
              ((LocalPointer<icu_63::BreakIterator> *)&boundaries,pBVar8);
  }
  UVar2 = LocalPointerBase<icu_63::UVector32>::isNull(&local_38);
  if (UVar2 != '\0') {
    pUVar9 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,(size_t)pBVar8);
    sText.fUnion.fStackFields.fBuffer[0x1a]._1_1_ = 0;
    local_110 = (UVector32 *)0x0;
    if (pUVar9 != (UVector32 *)0x0) {
      sText.fUnion.fStackFields.fBuffer[0x1a]._1_1_ = 1;
      UVector32::UVector32(pUVar9,(UErrorCode *)&bi);
      local_110 = pUVar9;
    }
    LocalPointer<icu_63::UVector32>::adoptInstead
              ((LocalPointer<icu_63::UVector32> *)&local_38,local_110);
  }
  UVar2 = LocalPointerBase<icu_63::BreakIterator>::isNull
                    ((LocalPointerBase<icu_63::BreakIterator> *)&boundaries);
  if (((UVar2 == '\0') &&
      (UVar2 = LocalPointerBase<icu_63::UVector32>::isNull(&local_38), UVar2 == '\0')) &&
     (UVar2 = ::U_FAILURE((UErrorCode)bi.super_LocalPointerBase<icu_63::BreakIterator>.ptr),
     UVar2 == '\0')) {
    pUVar9 = LocalPointerBase<icu_63::UVector32>::operator->(&local_38);
    UVector32::removeAllElements(pUVar9);
    replaceableAsString((UnicodeString *)&cp,text);
    pBVar8 = LocalPointerBase<icu_63::BreakIterator>::operator->
                       ((LocalPointerBase<icu_63::BreakIterator> *)&boundaries);
    (*(pBVar8->super_UObject)._vptr_UObject[7])(pBVar8,&cp);
    pBVar8 = LocalPointerBase<icu_63::BreakIterator>::operator->
                       ((LocalPointerBase<icu_63::BreakIterator> *)&boundaries);
    (*(pBVar8->super_UObject)._vptr_UObject[0x10])(pBVar8,(ulong)(uint)offsets->start);
    pBVar8 = LocalPointerBase<icu_63::BreakIterator>::operator->
                       ((LocalPointerBase<icu_63::BreakIterator> *)&boundaries);
    type = (*(pBVar8->super_UObject)._vptr_UObject[0xd])();
    while( true ) {
      bVar1 = false;
      if (type != -1) {
        bVar1 = type < offsets->limit;
      }
      if (!bVar1) break;
      if (type != 0) {
        UVar4 = icu_63::UnicodeString::char32At((UnicodeString *)&cp,type + -1);
        bVar3 = u_charType_63(UVar4);
        if ((1 << (bVar3 & 0x1f) & 0x1feU) != 0) {
          UVar4 = icu_63::UnicodeString::char32At((UnicodeString *)&cp,type);
          bVar3 = u_charType_63(UVar4);
          if ((1 << (bVar3 & 0x1f) & 0x1feU) != 0) {
            pUVar9 = LocalPointerBase<icu_63::UVector32>::operator->(&local_38);
            UVector32::addElement(pUVar9,type,(UErrorCode *)&bi);
          }
        }
      }
      pBVar8 = LocalPointerBase<icu_63::BreakIterator>::operator->
                         ((LocalPointerBase<icu_63::BreakIterator> *)&boundaries);
      type = (*(pBVar8->super_UObject)._vptr_UObject[0xd])();
    }
    local_b8 = 0;
    m_1.fMutex._4_4_ = 0;
    pUVar9 = LocalPointerBase<icu_63::UVector32>::operator->(&local_38);
    iVar5 = UVector32::size(pUVar9);
    if (iVar5 != 0) {
      pUVar9 = LocalPointerBase<icu_63::UVector32>::operator->(&local_38);
      iVar5 = UVector32::size(pUVar9);
      iVar6 = icu_63::UnicodeString::length(&this->fInsertion);
      local_b8 = iVar5 * iVar6;
      pUVar9 = LocalPointerBase<icu_63::UVector32>::operator->(&local_38);
      m_1.fMutex._4_4_ = UVector32::lastElementi(pUVar9);
      while( true ) {
        pUVar9 = LocalPointerBase<icu_63::UVector32>::operator->(&local_38);
        iVar5 = UVector32::size(pUVar9);
        if (iVar5 < 1) break;
        pUVar9 = LocalPointerBase<icu_63::UVector32>::operator->(&local_38);
        uVar7 = UVector32::popi(pUVar9);
        (*(text->super_UObject)._vptr_UObject[4])(text,(ulong)uVar7,(ulong)uVar7,&this->fInsertion);
      }
    }
    offsets->contextLimit = local_b8 + offsets->contextLimit;
    offsets->limit = local_b8 + offsets->limit;
    if (bi.super_LocalPointerBase<icu_63::BreakIterator>.ptr._7_1_ == '\0') {
      local_1c0 = offsets->limit;
    }
    else {
      local_1c0 = m_1.fMutex._4_4_ + local_b8;
    }
    offsets->start = local_1c0;
    Mutex::Mutex((Mutex *)&nonConstThis_1,(UMutex *)0x0);
    UVar2 = LocalPointerBase<icu_63::BreakIterator>::isNull
                      (&(this->cachedBI).super_LocalPointerBase<icu_63::BreakIterator>);
    if (UVar2 != '\0') {
      LocalPointer<icu_63::BreakIterator>::moveFrom
                (&this->cachedBI,(LocalPointer<icu_63::BreakIterator> *)&boundaries);
    }
    UVar2 = LocalPointerBase<icu_63::UVector32>::isNull
                      (&(this->cachedBoundaries).super_LocalPointerBase<icu_63::UVector32>);
    if (UVar2 != '\0') {
      LocalPointer<icu_63::UVector32>::moveFrom
                (&this->cachedBoundaries,(LocalPointer<icu_63::UVector32> *)&local_38);
    }
    Mutex::~Mutex((Mutex *)&nonConstThis_1);
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&cp);
    sText.fUnion._48_4_ = 0;
  }
  else {
    sText.fUnion._48_4_ = 1;
  }
  LocalPointer<icu_63::UVector32>::~LocalPointer((LocalPointer<icu_63::UVector32> *)&local_38);
  LocalPointer<icu_63::BreakIterator>::~LocalPointer
            ((LocalPointer<icu_63::BreakIterator> *)&boundaries);
  return;
}

Assistant:

void BreakTransliterator::handleTransliterate(Replaceable& text, UTransPosition& offsets,
                                                    UBool isIncremental ) const {

        UErrorCode status = U_ZERO_ERROR;
        LocalPointer<BreakIterator> bi;
        LocalPointer<UVector32> boundaries;

        {
            Mutex m;
            BreakTransliterator *nonConstThis = const_cast<BreakTransliterator *>(this);
            boundaries.moveFrom(nonConstThis->cachedBoundaries);
            bi.moveFrom(nonConstThis->cachedBI);
        }
        if (bi.isNull()) {
            bi.adoptInstead(BreakIterator::createWordInstance(Locale::getEnglish(), status));
        }
        if (boundaries.isNull()) {
            boundaries.adoptInstead(new UVector32(status));
        }

        if (bi.isNull() || boundaries.isNull() || U_FAILURE(status)) {
            return;
        }

        boundaries->removeAllElements();
        UnicodeString sText = replaceableAsString(text);
        bi->setText(sText);
        bi->preceding(offsets.start);

        // To make things much easier, we will stack the boundaries, and then insert at the end.
        // generally, we won't need too many, since we will be filtered.

        int32_t boundary;
        for(boundary = bi->next(); boundary != UBRK_DONE && boundary < offsets.limit; boundary = bi->next()) {
            if (boundary == 0) continue;
            // HACK: Check to see that preceeding item was a letter

            UChar32 cp = sText.char32At(boundary-1);
            int type = u_charType(cp);
            //System.out.println(Integer.toString(cp,16) + " (before): " + type);
            if ((U_MASK(type) & (U_GC_L_MASK | U_GC_M_MASK)) == 0) continue;

            cp = sText.char32At(boundary);
            type = u_charType(cp);
            //System.out.println(Integer.toString(cp,16) + " (after): " + type);
            if ((U_MASK(type) & (U_GC_L_MASK | U_GC_M_MASK)) == 0) continue;

            boundaries->addElement(boundary, status);
            // printf("Boundary at %d\n", boundary);
        }

        int delta = 0;
        int lastBoundary = 0;

        if (boundaries->size() != 0) { // if we found something, adjust
            delta = boundaries->size() * fInsertion.length();
            lastBoundary = boundaries->lastElementi();

            // we do this from the end backwards, so that we don't have to keep updating.

            while (boundaries->size() > 0) {
                boundary = boundaries->popi();
                text.handleReplaceBetween(boundary, boundary, fInsertion);
            }
        }

        // Now fix up the return values
        offsets.contextLimit += delta;
        offsets.limit += delta;
        offsets.start = isIncremental ? lastBoundary + delta : offsets.limit;

        // Return break iterator & boundaries vector to the cache.
        {
            Mutex m;
            BreakTransliterator *nonConstThis = const_cast<BreakTransliterator *>(this);
            if (nonConstThis->cachedBI.isNull()) {
                nonConstThis->cachedBI.moveFrom(bi);
            }
            if (nonConstThis->cachedBoundaries.isNull()) {
                nonConstThis->cachedBoundaries.moveFrom(boundaries);
            }
        }

        // TODO:  do something with U_FAILURE(status);
        //        (need to look at transliterators overall, not just here.)
}